

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O3

void close_unix_descriptors(void)

{
  void *__buf;
  undefined2 in_AX;
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  undefined8 uStack_38;
  
  if (NPROCS < 1) {
    uStack_38._0_3_ = CONCAT12(0x57,in_AX);
    uStack_38 = (ulong)(uint3)uStack_38;
    write(UnixPipeOut,(void *)((long)&uStack_38 + 2),6);
    iVar1 = UnixPipeIn;
    sVar3 = read(UnixPipeIn,(void *)((long)&uStack_38 + 2),6);
    if (sVar3 < 0) {
      piVar4 = __errno_location();
      do {
        if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
          perror("reading UnixPipeIn");
          break;
        }
        sVar3 = read(iVar1,(void *)((long)&uStack_38 + 2),6);
      } while (sVar3 < 0);
    }
    iVar1 = CONCAT13(uStack_38._7_1_,
                     CONCAT12(uStack_38._6_1_,uStack_38._2_2_ << 8 | uStack_38._2_2_ >> 8));
    if (iVar1 != 0) {
      __buf = (void *)((long)&uStack_38 + 2);
      do {
        if (0 < (long)NPROCS) {
          lVar6 = 0;
          do {
            if (*(int *)((long)&UJ->PID + lVar6) == iVar1) {
              uVar2 = (uint)uStack_38._5_1_;
              if (uStack_38._4_1_ != 0) {
                uVar2 = (uint)uStack_38._4_1_ << 8;
              }
              *(uint *)((long)&UJ->status + lVar6) = uVar2;
              break;
            }
            lVar6 = lVar6 + 0x18;
          } while ((long)NPROCS * 0x18 != lVar6);
        }
        uStack_38._0_3_ = CONCAT12(0x57,(short)uStack_38);
        uStack_38 = (ulong)(uint3)uStack_38;
        write(UnixPipeOut,__buf,6);
        iVar1 = UnixPipeIn;
        sVar3 = read(UnixPipeIn,__buf,6);
        if (sVar3 < 0) {
          piVar4 = __errno_location();
          do {
            if ((*piVar4 != 0xb) && (*piVar4 != 4)) {
              perror("reading UnixPipeIn");
              break;
            }
            sVar3 = read(iVar1,__buf,6);
          } while (sVar3 < 0);
        }
        iVar1 = CONCAT13(uStack_38._7_1_,
                         CONCAT12(uStack_38._6_1_,uStack_38._2_2_ << 8 | uStack_38._2_2_ >> 8));
      } while (iVar1 != 0);
    }
    return;
  }
  lVar6 = 0;
  lVar7 = 0;
  do {
    switch(*(undefined4 *)((long)&UJ->type + lVar6)) {
    case 0xfffffffc:
      goto switchD_001375b3_caseD_fffffffc;
    case 0xfffffffd:
      close((int)lVar7);
      pcVar5 = *(char **)((long)&UJ->pathname + lVar6);
      if (pcVar5 != (char *)0x0) {
        unlink(pcVar5);
        free(*(void **)((long)&UJ->pathname + lVar6));
        *(undefined8 *)((long)&UJ->pathname + lVar6) = 0;
      }
      break;
    case 0xfffffffe:
      iVar1 = kill(*(__pid_t *)((long)&UJ->PID + lVar6),9);
      if (iVar1 < 0) {
        pcVar5 = "Killing process";
LAB_00137662:
        perror(pcVar5);
      }
      goto LAB_0013761e;
    case 0xffffffff:
      iVar1 = kill(*(__pid_t *)((long)&UJ->PID + lVar6),9);
      if (iVar1 < 0) {
        pcVar5 = "Killing shell";
        goto LAB_00137662;
      }
LAB_0013761e:
      *(undefined4 *)((long)&UJ->PID + lVar6) = 0;
switchD_001375b3_caseD_fffffffc:
      close((int)lVar7);
    }
    *(undefined4 *)((long)&UJ->type + lVar6) = 0;
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0x18;
    if (NPROCS <= lVar7) {
      wait_for_comm_processes();
      return;
    }
  } while( true );
}

Assistant:

void close_unix_descriptors(void) /* Get ready to shut Maiko down */
{
  for (int slot = 0; slot < NPROCS; slot++) {
    /* If this slot has an active job */
    switch (UJ[slot].type) {
      case UJUNUSED:
        break;
      case UJSHELL:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing shell");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing shell desc %d.\n", slot));
        close(slot);
        break;

      case UJPROCESS:
        if (kill(UJ[slot].PID, SIGKILL) < 0) perror("Killing process");
        UJ[slot].PID = 0;
        DBPRINT(("Kill 5 closing process desc %d.\n", slot));
        close(slot);
        break;

      case UJSOCKET:
        close(slot);
        if (UJ[slot].pathname != NULL) {
          /* socket created directly from Lisp; pathname is in .pathname */
          DBPRINT(("Closing socket %d bound to %s\n", slot, UJ[slot].pathname));
          unlink(UJ[slot].pathname);
          free(UJ[slot].pathname);
          UJ[slot].pathname = NULL;
        }
        break;

      case UJSOSTREAM: close(slot); break;
    }
    UJ[slot].type = UJUNUSED;
  }

  /* make sure everyone's really dead before proceeding */
  wait_for_comm_processes();
}